

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O0

int32 print_counts(char *countfn,phnhashelement_t **CIhash,hashelement_t **CDhash)

{
  FILE *__stream;
  char *pcVar1;
  FILE *ofp;
  int32 ciheapsize;
  int32 cdheapsize;
  int32 heapsize;
  int32 i;
  phnhashelement_t *ciphone_el;
  hashelement_t *triphone_el;
  heapelement_t *addtriphone;
  heapelement_t *addphone;
  heapelement_t **CIheap;
  heapelement_t **CDheap;
  hashelement_t **CDhash_local;
  phnhashelement_t **CIhash_local;
  char *countfn_local;
  
  CIheap = (heapelement_t **)0x0;
  addphone = (heapelement_t *)0x0;
  CDheap = (heapelement_t **)CDhash;
  CDhash_local = (hashelement_t **)CIhash;
  CIhash_local = (phnhashelement_t **)countfn;
  __stream = fopen(countfn,"w");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x2b8,"Unable to open %s for writing. Not writing counts!\n",CIhash_local);
    countfn_local._4_4_ = -1;
  }
  else {
    fprintf(__stream,"base\tleft\tright\twdpos\tcount\n");
    ofp._0_4_ = 0;
    for (cdheapsize = 0; cdheapsize < 0x65; cdheapsize = cdheapsize + 1) {
      _heapsize = CDhash_local[cdheapsize];
      while (_heapsize != (hashelement_t *)0x0) {
        if (*(int *)&_heapsize->leftcontext < 1) {
          _heapsize = (hashelement_t *)_heapsize->rightcontext;
        }
        else {
          addtriphone = (heapelement_t *)
                        __ckd_calloc__(1,0x28,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                       ,0x2c5);
          pcVar1 = strdup(_heapsize->basephone);
          addtriphone->basephone = pcVar1;
          addtriphone->count = *(int32 *)&_heapsize->leftcontext;
          ofp._0_4_ = insert((heapelement_t ***)&addphone,(int32)ofp,addtriphone);
          _heapsize = (hashelement_t *)_heapsize->rightcontext;
        }
      }
    }
    ciheapsize = (int32)ofp;
    for (cdheapsize = 0; cdheapsize < ciheapsize; cdheapsize = cdheapsize + 1) {
      addtriphone = yanktop((heapelement_t ***)&addphone,(int32)ofp,(int32 *)&ofp);
      fprintf(__stream,"%s\t-\t-\t-\t%d\n",addtriphone->basephone,(ulong)(uint)addtriphone->count);
      free_heapelement(addtriphone);
    }
    ofp._4_4_ = 0;
    for (cdheapsize = 0; cdheapsize < 0x5dc1; cdheapsize = cdheapsize + 1) {
      ciphone_el = (phnhashelement_t *)CDheap[cdheapsize];
      while (ciphone_el != (phnhashelement_t *)0x0) {
        if (*(int *)&ciphone_el[1].field_0xc < 1) {
          ciphone_el = ciphone_el[1].next;
        }
        else {
          triphone_el = (hashelement_t *)
                        __ckd_calloc__(1,0x28,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                       ,0x2db);
          pcVar1 = strdup(ciphone_el->phone);
          triphone_el->basephone = pcVar1;
          pcVar1 = strdup(*(char **)&ciphone_el->count);
          triphone_el->leftcontext = pcVar1;
          pcVar1 = strdup((char *)ciphone_el->next);
          triphone_el->rightcontext = pcVar1;
          pcVar1 = strdup(ciphone_el[1].phone);
          triphone_el->wordposition = pcVar1;
          triphone_el->dictcount = *(int32 *)&ciphone_el[1].field_0xc;
          ofp._4_4_ = insert(&CIheap,ofp._4_4_,(heapelement_t *)triphone_el);
          ciphone_el = ciphone_el[1].next;
        }
      }
    }
    ciheapsize = ofp._4_4_;
    for (cdheapsize = 0; cdheapsize < ciheapsize; cdheapsize = cdheapsize + 1) {
      triphone_el = (hashelement_t *)yanktop(&CIheap,ofp._4_4_,(int32 *)((long)&ofp + 4));
      fprintf(__stream,"%s\t%s\t%s\t%s\t%d\n",triphone_el->basephone,triphone_el->leftcontext,
              triphone_el->rightcontext,triphone_el->wordposition,triphone_el->dictcount);
      free_heapelement((heapelement_t *)triphone_el);
    }
    fclose(__stream);
    countfn_local._4_4_ = 0;
  }
  return countfn_local._4_4_;
}

Assistant:

int32   print_counts(const char *countfn, phnhashelement_t  **CIhash,
		     hashelement_t **CDhash)
{
    heapelement_t **CDheap=NULL, **CIheap=NULL, *addphone, *addtriphone;
    hashelement_t *triphone_el; 
    phnhashelement_t *ciphone_el;
    int32 i, heapsize,cdheapsize,ciheapsize;
    FILE  *ofp;

    if ((ofp = fopen(countfn,"w")) == NULL){
	E_WARN("Unable to open %s for writing. Not writing counts!\n",countfn);
        return S3_ERROR;
    }
    fprintf(ofp,"base\tleft\tright\twdpos\tcount\n");

    ciheapsize = 0;
    for (i = 0; i < PHNHASHSIZE; i++){
	ciphone_el = CIhash[i];
	while (ciphone_el != NULL){
	    if (ciphone_el->count < 1) {
		ciphone_el = ciphone_el->next;
		continue;
	    }
	    addphone = (heapelement_t *) ckd_calloc(1,sizeof(heapelement_t));
	    addphone->basephone = strdup(ciphone_el->phone);
	    addphone->count = ciphone_el->count;
	    ciheapsize = insert(&CIheap, ciheapsize, addphone);
	    ciphone_el = ciphone_el->next;
        }
    }
    heapsize = ciheapsize;
    for (i = 0; i < heapsize; i++) {
        addphone = yanktop(&CIheap,ciheapsize,&ciheapsize);
	fprintf(ofp,"%s\t-\t-\t-\t%d\n",addphone->basephone,addphone->count);
	free_heapelement(addphone);
    }

    cdheapsize = 0;
    for (i = 0; i < HASHSIZE; i++){
	triphone_el = CDhash[i];
	while (triphone_el != NULL){
	    if (triphone_el->count < 1) {
		triphone_el = triphone_el->next;
		continue;
	    }
	    addtriphone = (heapelement_t *) ckd_calloc(1,sizeof(heapelement_t));
	    addtriphone->basephone = strdup(triphone_el->basephone);
	    addtriphone->leftcontext = strdup(triphone_el->leftcontext);
	    addtriphone->rightcontext = strdup(triphone_el->rightcontext);
	    addtriphone->wordposition = strdup(triphone_el->wordposition);
	    addtriphone->count = triphone_el->count;
	    cdheapsize = insert(&CDheap, cdheapsize, addtriphone);
	    triphone_el = triphone_el->next;
        }
    }
    heapsize = cdheapsize;
    for (i = 0; i < heapsize; i++) {
        addtriphone = yanktop(&CDheap,cdheapsize,&cdheapsize);
	fprintf(ofp,"%s\t%s\t%s\t%s\t%d\n",addtriphone->basephone,
					   addtriphone->leftcontext,
					   addtriphone->rightcontext,
					   addtriphone->wordposition,
					   addtriphone->count);
	free_heapelement(addtriphone);
    }
    fclose(ofp);
    return S3_SUCCESS;
}